

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O2

void init_keymap(void)

{
  nh_cmd_desc *pnVar1;
  nh_cmd_desc *pnVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = 0;
  memset(keymap,0,0xff8);
  keymap[0x103] = find_command("north");
  keymap[0x102] = find_command("south");
  keymap[0x104] = find_command("west");
  keymap[0x105] = find_command("east");
  keymap[0x15c] = find_command("north_west");
  keymap[0x15d] = find_command("north_east");
  keymap[0x15f] = find_command("south_west");
  keymap[0x160] = find_command("south_east");
  keymap[0x106] = find_command("north_west");
  keymap[0x153] = find_command("north_east");
  keymap[0x168] = find_command("south_west");
  keymap[0x152] = find_command("south_east");
  keymap[0xd] = find_command("(nothing)");
  pnVar1 = commandlist;
  pnVar2 = commandlist;
  uVar5 = uVar3;
  if (L'\0' < cmdcount) {
    uVar3 = (ulong)(uint)cmdcount;
    uVar5 = uVar3;
  }
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    if ((ulong)pnVar2->defkey != 0) {
      keymap[pnVar2->defkey] = pnVar2;
    }
    pnVar2 = pnVar2 + 1;
  }
  for (lVar4 = 0; pnVar2 = pnVar1, lVar4 != 0xe58; lVar4 = lVar4 + 0x6c) {
    if ((ulong)(byte)builtin_commands[0].desc[lVar4 + 0x50] != 0) {
      keymap[(byte)builtin_commands[0].desc[lVar4 + 0x50]] =
           (nh_cmd_desc *)(builtin_commands[0].name + lVar4);
    }
  }
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    uVar3 = (ulong)pnVar2->altkey;
    if ((uVar3 != 0) && (keymap[uVar3] == (nh_cmd_desc *)0x0)) {
      keymap[uVar3] = pnVar2;
    }
    pnVar2 = pnVar2 + 1;
  }
  for (lVar4 = 0; lVar4 != 0xe58; lVar4 = lVar4 + 0x6c) {
    if (((ulong)(byte)builtin_commands[0].desc[lVar4 + 0x51] != 0) &&
       (keymap[(byte)pnVar1->desc[lVar4 + 0x51]] == (nh_cmd_desc *)0x0)) {
      keymap[(byte)builtin_commands[0].desc[lVar4 + 0x51]] =
           (nh_cmd_desc *)(builtin_commands[0].name + lVar4);
    }
  }
  return;
}

Assistant:

static void init_keymap(void)
{
    int i;
    int count = sizeof(builtin_commands)/sizeof(struct nh_cmd_desc);
    
    memset(keymap, 0, sizeof(keymap));
    
    /* num pad direction keys */
    keymap[KEY_UP] = find_command("north");
    keymap[KEY_DOWN] = find_command("south");
    keymap[KEY_LEFT] = find_command("west");
    keymap[KEY_RIGHT] = find_command("east");
#if defined(PDCURSES)
    keymap[KEY_A2] = find_command("north");
    keymap[KEY_C2] = find_command("south");
    keymap[KEY_B1] = find_command("west");
    keymap[KEY_B3] = find_command("east");
#endif
    keymap[KEY_A1] = find_command("north_west");
    keymap[KEY_A3] = find_command("north_east");
    keymap[KEY_C1] = find_command("south_west");
    keymap[KEY_C3] = find_command("south_east");
    /* diagonal keypad keys are not necessarily reported as A1, A3, C1, C3 */
    keymap[KEY_HOME]  = find_command("north_west");
    keymap[KEY_PPAGE] = find_command("north_east");
    keymap[KEY_END]   = find_command("south_west");
    keymap[KEY_NPAGE] = find_command("south_east");
    keymap['\r'] = find_command("(nothing)");
    
    /* every command automatically gets its default key */
    for (i = 0; i < cmdcount; i++)
	if (commandlist[i].defkey)
	    keymap[keytrans(commandlist[i].defkey)] = &commandlist[i];
	
    for (i = 0; i < count; i++)
	if (builtin_commands[i].defkey)
	    keymap[keytrans(builtin_commands[i].defkey)] = &builtin_commands[i];
    
    /* alt keys are assigned if the key is not in use */
    for (i = 0; i < cmdcount; i++) {
	if (commandlist[i].altkey && !keymap[keytrans(commandlist[i].altkey)])
	    keymap[keytrans(commandlist[i].altkey)] = &commandlist[i];
    }
    
    for (i = 0; i < count; i++) {
	if (builtin_commands[i].altkey &&
	    !keymap[keytrans(commandlist[i].altkey)])
	    keymap[keytrans(builtin_commands[i].altkey)] = &builtin_commands[i];
    }
    
}